

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall google::protobuf::internal::DynamicMapField::~DynamicMapField(DynamicMapField *this)

{
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_00;
  iterator iter;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_30;
  
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase._vptr_MapFieldBase = (_func_int **)&PTR__DynamicMapField_006209e0;
  this_00 = &this->map_;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin((iterator *)&local_30,this_00)
  ;
  while (local_30.node_ != (Node *)0x0) {
    MapValueRef::DeleteData(&(((local_30.node_)->kv).v_)->second);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::operator++(&local_30);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(this_00);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::~Map(this_00);
  MapFieldBase::~MapFieldBase((MapFieldBase *)this);
  return;
}

Assistant:

DynamicMapField::~DynamicMapField() {
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  for (Map<MapKey, MapValueRef>::iterator iter = map_.begin();
       iter != map_.end(); ++iter) {
    iter->second.DeleteData();
  }
  map_.clear();
}